

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_state.hpp
# Opt level: O2

void __thiscall
duckdb::WindowQuantileState<duckdb::interval_t>::SkipListUpdater::Left
          (SkipListUpdater *this,idx_t begin,idx_t end)

{
  SkipListType *__filename;
  bool bVar1;
  interval_t *piVar2;
  idx_t local_68;
  idx_t local_60;
  undefined8 local_58;
  int64_t iStack_50;
  
  while (begin < end) {
    local_68 = begin;
    bVar1 = QuantileIncluded<duckdb::interval_t>::operator()(this->included,&local_68);
    if (bVar1) {
      __filename = this->skip;
      piVar2 = QuantileCursor<duckdb::interval_t>::operator[](this->data,local_68);
      local_60 = local_68;
      local_58._0_4_ = piVar2->months;
      local_58._4_4_ = piVar2->days;
      iStack_50 = piVar2->micros;
      duckdb_skiplistlib::skip_list::
      HeadNode<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>
      ::remove((HeadNode<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>
                *)&stack0xffffffffffffffb8,(char *)__filename);
    }
    begin = local_68 + 1;
  }
  return;
}

Assistant:

inline void Left(idx_t begin, idx_t end) {
			for (; begin < end; ++begin) {
				if (included(begin)) {
					skip.remove(SkipType(begin, data[begin]));
				}
			}
		}